

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

int cpoly(double *OPR,double *OPI,int DEGREE,double *ZEROR,double *ZEROI)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double local_180;
  double pit;
  double prt;
  int local_168;
  int i;
  int IDNN2;
  int CNT2;
  int CNT1;
  int NN;
  double BND;
  double ZI;
  double ZR;
  double XXX;
  double BASE;
  double SMALNO;
  double SINR;
  double COSR;
  double YY;
  double XX;
  double INFIN;
  double ETA;
  double MRE;
  double ARE;
  double PVI;
  double PVR;
  double TI;
  double TR;
  double SI;
  double SR;
  double *SHI;
  double *SHR;
  double *QHI;
  double *QHR;
  double *QPI;
  double *QPR;
  double *HI;
  double *HR;
  double *PI;
  double *PR;
  int CONV;
  int fail;
  double *ZEROI_local;
  double *ZEROR_local;
  double *pdStack_48;
  int DEGREE_local;
  double *OPI_local;
  double *OPR_local;
  
  _CONV = ZEROI;
  ZEROI_local = ZEROR;
  ZEROR_local._4_4_ = DEGREE;
  pdStack_48 = OPI;
  OPI_local = OPR;
  PI = (double *)malloc(800);
  HR = (double *)malloc(800);
  HI = (double *)malloc(800);
  QPR = (double *)malloc(800);
  QPI = (double *)malloc(800);
  QHR = (double *)malloc(800);
  QHI = (double *)malloc(800);
  SHR = (double *)malloc(800);
  SHI = (double *)malloc(800);
  SR = (double)malloc(800);
  mcon(&INFIN,&XX,&BASE,&XXX);
  MRE = INFIN;
  dVar3 = sqrt(2.0);
  ETA = dVar3 * 2.0 * INFIN;
  YY = 0.70710678;
  COSR = -0.70710678;
  SINR = -0.060756474;
  SMALNO = 0.99756405;
  PR._4_4_ = 0;
  CNT2 = ZEROR_local._4_4_ + 1;
  if ((((*OPI_local != 0.0) || (NAN(*OPI_local))) || (*pdStack_48 != 0.0)) || (NAN(*pdStack_48))) {
    while( true ) {
      bVar1 = true;
      if ((OPI_local[CNT2 + -1] == 0.0) && (!NAN(OPI_local[CNT2 + -1]))) {
        bVar1 = pdStack_48[CNT2 + -1] != 0.0;
      }
      if (bVar1) break;
      iVar2 = ZEROR_local._4_4_ - CNT2;
      local_168 = iVar2 + 2;
      ZEROI_local[iVar2 + 1] = 0.0;
      _CONV[iVar2 + 1] = 0.0;
      CNT2 = CNT2 + -1;
    }
    for (prt._4_4_ = 0; prt._4_4_ < CNT2; prt._4_4_ = prt._4_4_ + 1) {
      PI[prt._4_4_] = OPI_local[prt._4_4_];
      HR[prt._4_4_] = pdStack_48[prt._4_4_];
      dVar3 = CMOD(PI + prt._4_4_,HR + prt._4_4_);
      SHI[prt._4_4_] = dVar3;
    }
    _CNT1 = RESCALE(CNT2,SHI,INFIN,XX,BASE,XXX);
    if ((_CNT1 != 1.0) || (NAN(_CNT1))) {
      for (prt._4_4_ = 0; prt._4_4_ < CNT2; prt._4_4_ = prt._4_4_ + 1) {
        PI[prt._4_4_] = _CNT1 * PI[prt._4_4_];
        HR[prt._4_4_] = _CNT1 * HR[prt._4_4_];
      }
    }
    while (2 < CNT2) {
      for (prt._4_4_ = 0; prt._4_4_ < CNT2; prt._4_4_ = prt._4_4_ + 1) {
        dVar3 = CMOD(PI + prt._4_4_,HR + prt._4_4_);
        SHI[prt._4_4_] = dVar3;
      }
      _CNT1 = CAUCHY(CNT2,SHI,(double *)SR);
      IDNN2 = 1;
LAB_00139820:
      if (2 < IDNN2) {
        PR._4_4_ = 1;
        free(PI);
        free(HR);
        free(HI);
        free(QPR);
        free(QPI);
        free(QHR);
        free(QHI);
        free(SHR);
        free(SHI);
        free((void *)SR);
        return PR._4_4_;
      }
      NOSHFT(CNT2,5,&SI,&TR,PI,HR,QPI,QHR,&PVI,&ARE,MRE,ETA,INFIN,XX,HI,QPR,QHI,SHR,SHI,(double *)SR
             ,&TI,&PVR);
      i = 1;
      while( true ) {
        if (9 < i) goto LAB_00139c63;
        ZR = SINR * YY + -(SMALNO * COSR);
        COSR = SMALNO * YY + SINR * COSR;
        SI = _CNT1 * ZR;
        TR = _CNT1 * COSR;
        YY = ZR;
        FXSHFT(CNT2,i * 10,&ZI,&BND,(int *)&PR,&SI,&TR,PI,HR,QPI,QHR,&PVI,&ARE,MRE,ETA,INFIN,XX,HI,
               QPR,QHI,SHR,SHI,(double *)SR,&TI,&PVR);
        if ((int)PR == 1) break;
        i = i + 1;
      }
      iVar2 = ZEROR_local._4_4_ - CNT2;
      local_168 = iVar2 + 2;
      ZEROI_local[iVar2 + 1] = ZI;
      _CONV[iVar2 + 1] = BND;
      CNT2 = CNT2 + -1;
      for (prt._4_4_ = 0; prt._4_4_ < CNT2; prt._4_4_ = prt._4_4_ + 1) {
        PI[prt._4_4_] = QPI[prt._4_4_];
        HR[prt._4_4_] = QHR[prt._4_4_];
      }
    }
    pit = PI[1] * -1.0;
    local_180 = HR[1] * -1.0;
    CDIVID(&pit,&local_180,PI,HR,XX,ZEROI_local + (ZEROR_local._4_4_ + -1),
           _CONV + (ZEROR_local._4_4_ + -1));
    free(PI);
    free(HR);
    free(HI);
    free(QPR);
    free(QPI);
    free(QHR);
    free(QHI);
    free(SHR);
    free(SHI);
    free((void *)SR);
    OPR_local._4_4_ = PR._4_4_;
  }
  else {
    PR._4_4_ = 1;
    free(PI);
    free(HR);
    free(HI);
    free(QPR);
    free(QPI);
    free(QHR);
    free(QHI);
    free(SHR);
    free(SHI);
    free((void *)SR);
    OPR_local._4_4_ = PR._4_4_;
  }
  return OPR_local._4_4_;
LAB_00139c63:
  IDNN2 = IDNN2 + 1;
  goto LAB_00139820;
}

Assistant:

int cpoly(double *OPR, double *OPI, int DEGREE, double *ZEROR, double *ZEROI) {
	/* FINDS THE ZEROS OF A COMPLEX POLYNOMIAL.
	C OPR, OPI  -  DOUBLE PRECISION VECTORS OF REAL AND
	C IMAGINARY PARTS OF THE COEFFICIENTS IN
	C ORDER OF DECREASING POWERS.
	C DEGREE    -  INTEGER DEGREE OF POLYNOMIAL.
	C ZEROR, ZEROI  -  OUTPUT DOUBLE PRECISION VECTORS OF
	C REAL AND IMAGINARY PARTS OF THE ZEROS.
	C FAIL      -  OUTPUT LOGICAL PARAMETER,  TRUE  ONLY IF
	C LEADING COEFFICIENT IS ZERO OR IF CPOLY
	C HAS FOUND FEWER THAN DEGREE ZEROS.
	C THE PROGRAM HAS BEEN WRITTEN TO REDUCE THE CHANCE OF OVERFLOW
	C OCCURRING. IF IT DOES OCCUR, THERE IS STILL A POSSIBILITY THAT
	C THE ZEROFINDER WILL WORK PROVIDED THE OVERFLOWED QUANTITY IS
	C REPLACED BY A LARGE NUMBER.*/
	int fail,CONV;
	double *PR, *PI, *HR, *HI, *QPR, *QPI, *QHR, *QHI, *SHR, *SHI;
	double SR, SI, TR, TI, PVR, PVI, ARE, MRE, ETA, INFIN;
	double XX, YY, COSR, SINR, SMALNO, BASE, XXX, ZR, ZI, BND;
	int NN,CNT1,CNT2,IDNN2,i;
	double prt, pit;

	PR = (double*)malloc(sizeof(double)* 100);
	PI = (double*)malloc(sizeof(double)* 100);
	HR = (double*)malloc(sizeof(double)* 100);
	HI = (double*)malloc(sizeof(double)* 100);
	QPR = (double*)malloc(sizeof(double)* 100);
	QPI = (double*)malloc(sizeof(double)* 100);
	QHR = (double*)malloc(sizeof(double)* 100);
	QHI = (double*)malloc(sizeof(double)* 100);
	SHR = (double*)malloc(sizeof(double)* 100);
	SHI = (double*)malloc(sizeof(double)* 100);

	mcon(&ETA, &INFIN, &SMALNO, &BASE);

	ARE = ETA;
	MRE = 2.0*sqrt(2.0)*ETA;
	XX = .70710678;
	YY = -XX;
	COSR = -.060756474;
	SINR = .99756405;
	fail = 0;
	NN = DEGREE + 1;

	if (!(OPR[0] != 0.0 || OPI[0] != 0.0)) {
		fail = 1;
		free(PR);
		free(PI);
		free(HR);
		free(HI);
		free(QPR);
		free(QPI);
		free(QHR);
		free(QHI);
		free(SHR);
		free(SHI);
		return fail;
	}

	while (!(OPR[NN - 1] != 0.0 || OPI[NN - 1] != 0.0)) {
		IDNN2 = DEGREE - NN + 2;
		ZEROR[IDNN2 - 1] = 0.0;
		ZEROI[IDNN2 - 1] = 0.0;
		NN = NN - 1;
	}

	for (i = 0; i < NN; ++i) {
		PR[i] = OPR[i];
		PI[i] = OPI[i];
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = RESCALE(NN, SHR, ETA, INFIN, SMALNO, BASE);

	if (BND != 1.0) {
		for (i = 0; i < NN; ++i) {
			PR[i] = BND*PR[i];
			PI[i] = BND*PI[i];
		}
	}

	NNITER: if (NN <= 2) {
				prt = -1.0 * PR[1];
				pit = -1.0 * PI[1];
				CDIVID(&prt, &pit, &PR[0], &PI[0], INFIN, &ZEROR[DEGREE - 1], &ZEROI[DEGREE - 1]);
				free(PR);
				free(PI);
				free(HR);
				free(HI);
				free(QPR);
				free(QPI);
				free(QHR);
				free(QHI);
				free(SHR);
				free(SHI);
				return fail;
			}

	for (i = 0; i < NN; ++i) {
		SHR[i] = CMOD(&PR[i], &PI[i]);
	}

	BND = CAUCHY(NN, SHR, SHI);

	/*
	C OUTER LOOP TO CONTROL 2 MAJOR PASSES WITH DIFFERENT SEQUENCES
	C OF SHIFTS.
	*/

	for (CNT1 = 1; CNT1 <= 2; ++CNT1) {
		//C FIRST STAGE CALCULATION, NO SHIFT.
		NOSHFT(NN, 5, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
		//C INNER LOOP TO SELECT A SHIFT.
		for (CNT2 = 1; CNT2 <= 9; ++CNT2) {
			//C SHIFT IS CHOSEN WITH MODULUS BND AND AMPLITUDE ROTATED BY
			//C 94 DEGREES FROM THE PREVIOUS SHIFT
			XXX = COSR*XX - SINR*YY;
			YY = SINR*XX + COSR*YY;
			XX = XXX;
			SR = BND*XX;
			SI = BND*YY;
			//C SECOND STAGE CALCULATION, FIXED SHIFT.
			FXSHFT(NN, 10*CNT2, &ZR, &ZI, &CONV, &SR, &SI, PR, PI, QPR, QPI, &PVR, &PVI, ARE, MRE, ETA, INFIN, HR, HI, QHR, QHI, SHR, SHI, &TR, &TI);
			if (CONV == 1) {
				//C THE SECOND STAGE JUMPS DIRECTLY TO THE THIRD STAGE ITERATION.
				//C IF SUCCESSFUL THE ZERO IS STORED AND THE POLYNOMIAL DEFLATED.
				IDNN2 = DEGREE - NN + 2;
				ZEROR[IDNN2 - 1] = ZR;
				ZEROI[IDNN2 - 1] = ZI;
				NN = NN - 1;
				for (i = 0; i < NN; ++i) {
					PR[i] = QPR[i];
					PI[i] = QPI[i];
				}
				goto NNITER;
			}//80
		}
	}

	fail = 1;

	free(PR);
	free(PI);
	free(HR);
	free(HI);
	free(QPR);
	free(QPI);
	free(QHR);
	free(QHI);
	free(SHR);
	free(SHI);
	return fail;
}